

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionReport.h
# Opt level: O3

void __thiscall
FIX50::ExecutionReport::ExecutionReport
          (ExecutionReport *this,OrderID *aOrderID,ExecID *aExecID,ExecType *aExecType,
          OrdStatus *aOrdStatus,Side *aSide,LeavesQty *aLeavesQty,CumQty *aCumQty)

{
  FieldBase local_88;
  
  MsgType();
  FIX50::Message::Message(&this->super_Message,(MsgType *)&local_88);
  FIX::FieldBase::~FieldBase(&local_88);
  *(undefined ***)&this->super_Message = &PTR__Message_0032ada0;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrderID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aExecID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aExecType,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrdStatus,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSide,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aLeavesQty,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aCumQty,true);
  return;
}

Assistant:

ExecutionReport(
      const FIX::OrderID& aOrderID,
      const FIX::ExecID& aExecID,
      const FIX::ExecType& aExecType,
      const FIX::OrdStatus& aOrdStatus,
      const FIX::Side& aSide,
      const FIX::LeavesQty& aLeavesQty,
      const FIX::CumQty& aCumQty )
    : Message(MsgType())
    {
      set(aOrderID);
      set(aExecID);
      set(aExecType);
      set(aOrdStatus);
      set(aSide);
      set(aLeavesQty);
      set(aCumQty);
    }